

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddChrpathPatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  pointer *ppbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar2;
  byte bVar3;
  __type _Var4;
  PolicyStatus PVar5;
  cmMakefile *pcVar6;
  string *psVar7;
  cmGlobalGenerator *pcVar8;
  ostream *poVar9;
  undefined1 local_5e0 [8];
  string escapedNewRpath;
  string escapedOldRpath;
  undefined1 local_598 [8];
  string newRpath;
  string oldRpath;
  _Self local_548;
  _Self local_540;
  undefined1 local_538 [8];
  string runpath_1;
  string *i_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  _Self local_4d8;
  _Self local_4d0;
  undefined1 local_4c8 [8];
  string runpath;
  string *i;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runpaths;
  undefined1 local_438 [8];
  ostringstream msg;
  int local_2bc;
  istringstream aiStack_2b8 [4];
  int darwin_major_version;
  istringstream ss;
  allocator<char> local_131;
  string local_130;
  string local_110 [8];
  string darwin_major_version_s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRuntimeDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldRuntimeDirs;
  string local_b8;
  string local_98 [8];
  string installNameTool;
  allocator<char> local_61;
  string local_60;
  cmMakefile *local_40;
  cmMakefile *mf;
  cmComputeLinkInformation *cli;
  string *toDestDirPath_local;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  if ((this->ImportLibrary & 1U) != 0) {
    return;
  }
  cli = (cmComputeLinkInformation *)toDestDirPath;
  toDestDirPath_local = config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  bVar2 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
  if (!bVar2) {
    return;
  }
  mf = (cmMakefile *)cmGeneratorTarget::GetLinkInformation(this->Target,toDestDirPath_local);
  if (mf == (cmMakefile *)0x0) {
    return;
  }
  pcVar6 = cmTarget::GetMakefile(this->Target->Target);
  local_40 = pcVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_61);
  bVar2 = cmMakefile::IsOn(pcVar6,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pcVar6 = local_40;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"CMAKE_INSTALL_NAME_TOOL",
               (allocator<char> *)
               ((long)&oldRuntimeDirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    psVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_b8);
    std::__cxx11::string::string(local_98,(string *)psVar7);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&oldRuntimeDirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ppbVar1 = &newRuntimeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&darwin_major_version_s.field_2 + 8));
    cmComputeLinkInformation::GetRPath
              ((cmComputeLinkInformation *)mf,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1,false);
    cmComputeLinkInformation::GetRPath
              ((cmComputeLinkInformation *)mf,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&darwin_major_version_s.field_2 + 8),true);
    pcVar6 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"DARWIN_MAJOR_VERSION",&local_131);
    psVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_130);
    std::__cxx11::string::string(local_110,(string *)psVar7);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::__cxx11::istringstream::istringstream(aiStack_2b8,local_110,_S_in);
    std::istream::operator>>(aiStack_2b8,&local_2bc);
    bVar3 = std::ios::fail();
    if ((((bVar3 & 1) != 0) || (9 < local_2bc)) ||
       ((bVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&newRuntimeDirs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2 &&
        (bVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&darwin_major_version_s.field_2 + 8)), bVar2)))) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range3);
      ppbVar1 = &newRuntimeDirs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)ppbVar1);
      i = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)ppbVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&i), bVar2) {
        runpath.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3);
        pcVar8 = cmMakefile::GetGlobalGenerator(local_40);
        (*pcVar8->_vptr_cmGlobalGenerator[0x14])
                  (local_4c8,pcVar8,runpath.field_2._8_8_,toDestDirPath_local);
        local_4d0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3,(key_type *)local_4c8);
        local_4d8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
        bVar2 = std::operator==(&local_4d0,&local_4d8);
        if (bVar2) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3,(value_type *)local_4c8);
          poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
          poVar9 = std::operator<<(poVar9,"execute_process(COMMAND ");
          poVar9 = std::operator<<(poVar9,local_98);
          std::operator<<(poVar9,"\n");
          poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
          poVar9 = std::operator<<(poVar9,"  -delete_rpath \"");
          poVar9 = std::operator<<(poVar9,(string *)local_4c8);
          std::operator<<(poVar9,"\"\n");
          poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
          poVar9 = std::operator<<(poVar9,"  \"");
          poVar9 = std::operator<<(poVar9,(string *)cli);
          std::operator<<(poVar9,"\")\n");
        }
        std::__cxx11::string::~string((string *)local_4c8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&darwin_major_version_s.field_2 + 8);
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this_00);
      i_1 = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&i_1), bVar2) {
        runpath_1.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3_1);
        pcVar8 = cmMakefile::GetGlobalGenerator(local_40);
        (*pcVar8->_vptr_cmGlobalGenerator[0x14])
                  (local_538,pcVar8,runpath_1.field_2._8_8_,toDestDirPath_local);
        local_540._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3,(key_type *)local_538);
        local_548._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
        bVar2 = std::operator==(&local_540,&local_548);
        if (bVar2) {
          poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
          poVar9 = std::operator<<(poVar9,"execute_process(COMMAND ");
          poVar9 = std::operator<<(poVar9,local_98);
          std::operator<<(poVar9,"\n");
          poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
          poVar9 = std::operator<<(poVar9,"  -add_rpath \"");
          poVar9 = std::operator<<(poVar9,(string *)local_538);
          std::operator<<(poVar9,"\"\n");
          poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
          poVar9 = std::operator<<(poVar9,"  \"");
          poVar9 = std::operator<<(poVar9,(string *)cli);
          std::operator<<(poVar9,"\")\n");
        }
        std::__cxx11::string::~string((string *)local_538);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
      poVar9 = std::operator<<((ostream *)local_438,"WARNING: Target \"");
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      poVar9 = std::operator<<(poVar9,(string *)psVar7);
      poVar9 = std::operator<<(poVar9,
                               "\" has runtime paths which cannot be changed during install.  ");
      poVar9 = std::operator<<(poVar9,
                               "To change runtime paths, OS X version 10.6 or newer is required.  ")
      ;
      poVar9 = std::operator<<(poVar9,
                               "Therefore, runtime paths will not be changed when installing.  ");
      std::operator<<(poVar9,
                      "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around this limitation.");
      pcVar6 = local_40;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage
                (pcVar6,WARNING,(string *)&runpaths._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      std::__cxx11::string::~string
                ((string *)&runpaths._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    }
    std::__cxx11::istringstream::~istringstream(aiStack_2b8);
    std::__cxx11::string::~string(local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&darwin_major_version_s.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&newRuntimeDirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_98);
    return;
  }
  cmComputeLinkInformation::GetRPathString_abi_cxx11_
            ((string *)((long)&newRpath.field_2 + 8),(cmComputeLinkInformation *)mf,false);
  cmComputeLinkInformation::GetChrpathString_abi_cxx11_
            ((string *)local_598,(cmComputeLinkInformation *)mf);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&newRpath.field_2 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_598);
  if (_Var4) goto LAB_005eb096;
  cmOutputConverter::EscapeForCMake
            ((string *)((long)&escapedNewRpath.field_2 + 8),(string *)((long)&newRpath.field_2 + 8))
  ;
  cmOutputConverter::EscapeForCMake((string *)local_5e0,(string *)local_598);
  poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
  poVar9 = std::operator<<(poVar9,"file(RPATH_CHANGE\n");
  poVar9 = ::operator<<(poVar9,(cmScriptGeneratorIndent)this_local._4_4_);
  poVar9 = std::operator<<(poVar9,"     FILE \"");
  poVar9 = std::operator<<(poVar9,(string *)cli);
  poVar9 = std::operator<<(poVar9,"\"\n");
  poVar9 = ::operator<<(poVar9,(cmScriptGeneratorIndent)this_local._4_4_);
  poVar9 = std::operator<<(poVar9,"     OLD_RPATH ");
  poVar9 = std::operator<<(poVar9,(string *)(escapedNewRpath.field_2._M_local_buf + 8));
  std::operator<<(poVar9,"\n");
  PVar5 = cmGeneratorTarget::GetPolicyStatusCMP0095(this->Target);
  if (PVar5 == OLD) {
LAB_005eaf94:
    poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar9 = std::operator<<(poVar9,"     NEW_RPATH \"");
    poVar9 = std::operator<<(poVar9,(string *)local_598);
    std::operator<<(poVar9,"\")\n");
  }
  else {
    if (PVar5 == WARN) {
      IssueCMP0095Warning(this,(string *)local_598);
      goto LAB_005eaf94;
    }
    poVar9 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent)this_local._4_4_);
    poVar9 = std::operator<<(poVar9,"     NEW_RPATH ");
    poVar9 = std::operator<<(poVar9,(string *)local_5e0);
    std::operator<<(poVar9,")\n");
  }
  std::__cxx11::string::~string((string *)local_5e0);
  std::__cxx11::string::~string((string *)(escapedNewRpath.field_2._M_local_buf + 8));
LAB_005eb096:
  std::__cxx11::string::~string((string *)local_598);
  std::__cxx11::string::~string((string *)(newRpath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmInstallTargetGenerator::AddChrpathPatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  cmMakefile* mf = this->Target->Target->GetMakefile();

  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // If using install_name_tool, set up the rules to modify the rpaths.
    std::string installNameTool =
      mf->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL");

    std::vector<std::string> oldRuntimeDirs, newRuntimeDirs;
    cli->GetRPath(oldRuntimeDirs, false);
    cli->GetRPath(newRuntimeDirs, true);

    std::string darwin_major_version_s =
      mf->GetSafeDefinition("DARWIN_MAJOR_VERSION");

    std::istringstream ss(darwin_major_version_s);
    int darwin_major_version;
    ss >> darwin_major_version;
    if (!ss.fail() && darwin_major_version <= 9 &&
        (!oldRuntimeDirs.empty() || !newRuntimeDirs.empty())) {
      std::ostringstream msg;
      msg
        << "WARNING: Target \"" << this->Target->GetName()
        << "\" has runtime paths which cannot be changed during install.  "
        << "To change runtime paths, OS X version 10.6 or newer is required.  "
        << "Therefore, runtime paths will not be changed when installing.  "
        << "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around"
           " this limitation.";
      mf->IssueMessage(MessageType::WARNING, msg.str());
    } else {
      // Note: These paths are kept unique to avoid
      // install_name_tool corruption.
      std::set<std::string> runpaths;
      for (std::string const& i : oldRuntimeDirs) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          runpaths.insert(runpath);
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -delete_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }

      runpaths.clear();
      for (std::string const& i : newRuntimeDirs) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -add_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }
    }
  } else {
    // Construct the original rpath string to be replaced.
    std::string oldRpath = cli->GetRPathString(false);

    // Get the install RPATH from the link information.
    std::string newRpath = cli->GetChrpathString();

    // Skip the rule if the paths are identical
    if (oldRpath == newRpath) {
      return;
    }

    // Escape any CMake syntax in the RPATHs.
    std::string escapedOldRpath = cmOutputConverter::EscapeForCMake(oldRpath);
    std::string escapedNewRpath = cmOutputConverter::EscapeForCMake(newRpath);

    // Write a rule to run chrpath to set the install-tree RPATH
    os << indent << "file(RPATH_CHANGE\n"
       << indent << "     FILE \"" << toDestDirPath << "\"\n"
       << indent << "     OLD_RPATH " << escapedOldRpath << "\n";

    // CMP0095: ``RPATH`` entries are properly escaped in the intermediary
    // CMake install script.
    switch (this->Target->GetPolicyStatusCMP0095()) {
      case cmPolicies::WARN:
        this->IssueCMP0095Warning(newRpath);
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        os << indent << "     NEW_RPATH \"" << newRpath << "\")\n";
        break;
      default:
        os << indent << "     NEW_RPATH " << escapedNewRpath << ")\n";
        break;
    }
  }
}